

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  ushort uVar10;
  mz_bool mVar11;
  uint uVar12;
  size_t sVar13;
  mz_zip_internal_state *pmVar14;
  ulong uVar15;
  short *__ptr;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  long lVar19;
  uint uVar20;
  size_t sVar21;
  mz_zip_error mVar22;
  mz_uint32 mVar23;
  int *piVar24;
  ulong uVar25;
  mz_uint32 t;
  ulong uVar26;
  long lVar27;
  short *psVar28;
  uint uVar29;
  mz_uint64 mVar30;
  mz_zip_internal_state *pmVar31;
  mz_uint64 mVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  
  uVar17 = pZip->m_archive_size;
  mVar22 = MZ_ZIP_NOT_AN_ARCHIVE;
  if (0x15 < uVar17) {
    mVar32 = 0;
    if (0x1000 < (long)uVar17) {
      mVar32 = uVar17 - 0x1000;
    }
    do {
      sVar21 = uVar17 - mVar32;
      if (0xfff < sVar21) {
        sVar21 = 0x1000;
      }
      sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar32,buf_u32,sVar21);
      if (sVar13 != sVar21) break;
      for (uVar20 = (int)sVar21 - 4; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
        if ((*(int *)((long)buf_u32 + (ulong)uVar20) == 0x6054b50) &&
           (mVar30 = uVar20 + mVar32, 0x15 < pZip->m_archive_size - mVar30)) {
          sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar30,buf_u32,0x16);
          if (sVar21 != 0x16) goto LAB_002626f3;
          if (buf_u32[0] != 0x6054b50) {
            mVar22 = MZ_ZIP_NOT_AN_ARCHIVE;
            goto LAB_002626f6;
          }
          if (((0x4b < (long)mVar30) &&
              (sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar30 - 0x14,
                                         zip64_end_of_central_dir_locator_u32,0x14), sVar21 == 0x14)
              ) && (zip64_end_of_central_dir_locator_u32[0] == 0x7064b50)) {
            mVar22 = MZ_ZIP_NOT_AN_ARCHIVE;
            if (pZip->m_archive_size - 0x38 < (ulong)zip64_end_of_central_dir_locator_u32._8_8_)
            goto LAB_002626f6;
            sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,zip64_end_of_central_dir_locator_u32._8_8_,
                                      zip64_end_of_central_dir_header_u32,0x38);
            if ((sVar21 == 0x38) && (zip64_end_of_central_dir_header_u32[0] == 0x6064b50)) {
              pZip->m_pState->m_zip64 = 1;
            }
          }
          pZip->m_total_files = (uint)buf_u32[2]._2_2_;
          pmVar31 = pZip->m_pState;
          if (pmVar31->m_zip64 == 0) {
            zip64_end_of_central_dir_header_u32[6] = (mz_uint32)(ushort)buf_u32[2];
            zip64_end_of_central_dir_header_u32[5] = (mz_uint32)buf_u32[1]._2_2_;
            uVar17 = (ulong)buf_u32[4];
            mVar23 = buf_u32[3];
            zip64_end_of_central_dir_header_u32[8] = (uint)buf_u32[2]._2_2_;
            uVar20 = (uint)(ushort)buf_u32[1];
LAB_00261f30:
            if ((zip64_end_of_central_dir_header_u32[8] != zip64_end_of_central_dir_header_u32[6])
               || ((uVar20 != 0 || zip64_end_of_central_dir_header_u32[5] != 0 &&
                   (zip64_end_of_central_dir_header_u32[5] != 1 || uVar20 != 1)))) {
LAB_0026207b:
              mVar22 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
              goto LAB_002626f6;
            }
            if ((zip64_end_of_central_dir_header_u32[8] * 0x2e <= mVar23) &&
               (uVar25 = (ulong)mVar23, uVar17 + uVar25 <= pZip->m_archive_size)) {
              pZip->m_central_directory_file_ofs = uVar17;
              if (zip64_end_of_central_dir_header_u32[8] == 0) {
                return 1;
              }
              pmVar14 = pmVar31;
              if ((pmVar31->m_central_dir).m_capacity < uVar25) {
                mVar11 = mz_zip_array_ensure_capacity(pZip,&pmVar31->m_central_dir,uVar25,0);
                if (mVar11 == 0) goto LAB_002622f5;
                pmVar14 = pZip->m_pState;
                zip64_end_of_central_dir_header_u32[8] = pZip->m_total_files;
              }
              (pmVar31->m_central_dir).m_size = uVar25;
              uVar15 = (ulong)zip64_end_of_central_dir_header_u32[8];
              pmVar31 = pmVar14;
              if ((pmVar14->m_central_dir_offsets).m_capacity < uVar15) {
                mVar11 = mz_zip_array_ensure_capacity(pZip,&pmVar14->m_central_dir_offsets,uVar15,0)
                ;
                if (mVar11 == 0) goto LAB_002622f5;
                pmVar31 = pZip->m_pState;
              }
              (pmVar14->m_central_dir_offsets).m_size = uVar15;
              if ((flags >> 0xb & 1) == 0) {
                uVar15 = (ulong)pZip->m_total_files;
                pmVar14 = pmVar31;
                if ((pmVar31->m_sorted_central_dir_offsets).m_capacity < uVar15) {
                  mVar11 = mz_zip_array_ensure_capacity
                                     (pZip,&pmVar31->m_sorted_central_dir_offsets,uVar15,0);
                  if (mVar11 == 0) goto LAB_002622f5;
                  pmVar14 = pZip->m_pState;
                }
                (pmVar31->m_sorted_central_dir_offsets).m_size = uVar15;
                pmVar31 = pmVar14;
              }
              sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar17,(pmVar31->m_central_dir).m_p,
                                        uVar25);
              if (sVar21 != uVar25) goto LAB_002626f3;
              piVar24 = (int *)(pZip->m_pState->m_central_dir).m_p;
              uVar25 = 0;
              goto LAB_002620e5;
            }
          }
          else if (0x2b < (ulong)zip64_end_of_central_dir_header_u32._4_8_) {
            if (zip64_end_of_central_dir_locator_u32[4] != 1) goto LAB_0026207b;
            mVar22 = MZ_ZIP_TOO_MANY_FILES;
            if ((zip64_end_of_central_dir_header_u32[9] == 0) &&
               (pZip->m_total_files = zip64_end_of_central_dir_header_u32[8],
               zip64_end_of_central_dir_header_u32[7] == 0)) {
              uVar17 = zip64_end_of_central_dir_header_u32._48_8_;
              mVar23 = zip64_end_of_central_dir_header_u32[10];
              uVar20 = zip64_end_of_central_dir_header_u32[4];
              if (zip64_end_of_central_dir_header_u32[0xb] == 0) goto LAB_00261f30;
              mVar22 = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
            }
            goto LAB_002626f6;
          }
          mVar22 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          goto LAB_002626f6;
        }
      }
      if (mVar32 == 0) break;
      uVar17 = pZip->m_archive_size;
      uVar25 = uVar17 - mVar32;
      mVar32 = mVar32 - 0xffd;
    } while (uVar25 < 0x10015);
    mVar22 = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
LAB_002626f6:
  pZip->m_last_error = mVar22;
  return 0;
LAB_002620e5:
  uVar12 = pZip->m_total_files;
  uVar15 = (ulong)uVar12;
  if (uVar15 <= uVar25) goto LAB_0026230f;
  if ((mVar23 < 0x2e) || (*piVar24 != 0x2014b50)) {
LAB_00262301:
    mVar22 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    goto LAB_002626f6;
  }
  pmVar31 = pZip->m_pState;
  *(int *)((long)(pmVar31->m_central_dir_offsets).m_p + uVar25 * 4) =
       (int)piVar24 - *(int *)&(pmVar31->m_central_dir).m_p;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar31->m_sorted_central_dir_offsets).m_p + uVar25 * 4) = (int)uVar25;
  }
  uVar12 = piVar24[5];
  uVar5 = piVar24[6];
  if ((pmVar31->m_zip64_has_extended_info_fields == 0) &&
     (uVar3 = *(ushort *)((long)piVar24 + 0x1e), uVar3 != 0)) {
    uVar29 = uVar5;
    if (uVar5 < uVar12) {
      uVar29 = uVar12;
    }
    if (uVar29 <= *(uint *)((long)piVar24 + 0x2a)) {
      uVar29 = *(uint *)((long)piVar24 + 0x2a);
    }
    if (uVar29 == 0xffffffff) {
      uVar4 = *(ushort *)(piVar24 + 7);
      uVar15 = (ulong)uVar3;
      if (mVar23 < uVar4 + 0x2e + (uint)uVar3) {
        __ptr = (short *)malloc(uVar15);
        if (__ptr == (short *)0x0) goto LAB_002622f5;
        sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(ulong)uVar4 + uVar17 + 0x2e,__ptr,uVar15);
        psVar28 = __ptr;
        if (sVar21 != uVar15) {
          free(__ptr);
LAB_002626f3:
          mVar22 = MZ_ZIP_FILE_READ_FAILED;
          goto LAB_002626f6;
        }
      }
      else {
        __ptr = (short *)0x0;
        psVar28 = (short *)((long)piVar24 + (ulong)uVar4 + 0x2e);
      }
      do {
        if ((uint)uVar15 < 4) {
LAB_002622fc:
          free(__ptr);
          goto LAB_00262301;
        }
        uVar16 = (ulong)(ushort)psVar28[1] + 4;
        if (uVar15 < uVar16) goto LAB_002622fc;
        if (*psVar28 == 1) {
          pmVar31 = pZip->m_pState;
          pmVar31->m_zip64 = 1;
          pmVar31->m_zip64_has_extended_info_fields = 1;
          break;
        }
        uVar29 = ((uint)uVar15 - (uint)(ushort)psVar28[1]) - 4;
        uVar15 = (ulong)uVar29;
        psVar28 = (short *)((long)psVar28 + uVar16);
      } while (uVar29 != 0);
      free(__ptr);
    }
  }
  if ((uVar5 != 0xffffffff && uVar12 != 0xffffffff) &&
     ((uVar5 != uVar12 && *(int *)((long)piVar24 + 10) == 0 || (uVar12 == 0 && uVar5 != 0))))
  goto LAB_00262301;
  uVar3 = *(ushort *)((long)piVar24 + 0x22);
  if ((uVar3 == 0xffff) || ((uVar3 != 1 && (uVar20 != uVar3)))) {
    mVar22 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    goto LAB_002626f6;
  }
  if ((uVar12 != 0xffffffff) &&
     (pZip->m_archive_size < (ulong)*(uint *)((long)piVar24 + 0x2a) + (ulong)uVar12 + 0x1e))
  goto LAB_00262301;
  if ((*(byte *)((long)piVar24 + 9) & 0x20) != 0) {
    mVar22 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    goto LAB_002626f6;
  }
  uVar12 = (uint)*(ushort *)(piVar24 + 8) +
           (uint)*(ushort *)((long)piVar24 + 0x1e) + (uint)*(ushort *)(piVar24 + 7) + 0x2e;
  bVar35 = mVar23 < uVar12;
  mVar23 = mVar23 - uVar12;
  if (bVar35) goto LAB_00262301;
  piVar24 = (int *)((long)piVar24 + (ulong)uVar12);
  uVar25 = uVar25 + 1;
  goto LAB_002620e5;
LAB_002622f5:
  mVar22 = MZ_ZIP_ALLOC_FAILED;
  goto LAB_002626f6;
LAB_0026230f:
  if (((flags >> 0xb & 1) == 0) && (1 < uVar12)) {
    pmVar31 = pZip->m_pState;
    puVar6 = (uint *)(pmVar31->m_sorted_central_dir_offsets).m_p;
    uVar17 = (ulong)(uVar12 - 2 >> 1);
    uVar25 = uVar17;
LAB_0026234d:
    do {
      uVar16 = uVar17 * 2 + 1;
      if (uVar16 < uVar15) {
        pvVar7 = (pmVar31->m_central_dir).m_p;
        pvVar8 = (pmVar31->m_central_dir_offsets).m_p;
        if (uVar17 * 2 + 2 < uVar15) {
          uVar34 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[uVar16] * 4);
          uVar26 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[uVar17 * 2 + 2] * 4);
          uVar3 = *(ushort *)((long)pvVar7 + uVar34 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar7 + uVar26 + 0x1c);
          uVar10 = uVar4;
          if (uVar3 < uVar4) {
            uVar10 = uVar3;
          }
          bVar18 = 0;
          for (uVar33 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar33 + uVar34 + 0x2e), bVar9 = bVar18,
              pbVar1 < (byte *)((long)pvVar7 + uVar10 + uVar34 + 0x2e); uVar33 = uVar33 + 1) {
            bVar9 = *pbVar1;
            bVar18 = bVar9 + 0x20;
            if (0x19 < (byte)(bVar9 + 0xbf)) {
              bVar18 = bVar9;
            }
            bVar2 = *(byte *)((long)pvVar7 + uVar33 + uVar26 + 0x2e);
            bVar9 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar9 = bVar2;
            }
            if (bVar18 != bVar9) break;
          }
          bVar35 = bVar18 < bVar9;
          if (uVar10 == uVar33) {
            bVar35 = uVar3 < uVar4;
          }
          uVar26 = (ulong)bVar35;
        }
        else {
          uVar26 = 0;
        }
        uVar26 = uVar26 + uVar16;
        uVar20 = puVar6[uVar17];
        uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar20 * 4);
        uVar34 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[uVar26] * 4);
        uVar3 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar7 + uVar34 + 0x1c);
        uVar10 = uVar4;
        if (uVar3 < uVar4) {
          uVar10 = uVar3;
        }
        bVar18 = 0;
        for (uVar33 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar33 + uVar16 + 0x2e), bVar9 = bVar18,
            pbVar1 < (byte *)((long)pvVar7 + uVar10 + uVar16 + 0x2e); uVar33 = uVar33 + 1) {
          bVar9 = *pbVar1;
          bVar18 = bVar9 + 0x20;
          if (0x19 < (byte)(bVar9 + 0xbf)) {
            bVar18 = bVar9;
          }
          bVar2 = *(byte *)((long)pvVar7 + uVar33 + uVar34 + 0x2e);
          bVar9 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar9 = bVar2;
          }
          if (bVar18 != bVar9) break;
        }
        bVar35 = bVar9 <= bVar18;
        if (uVar10 == uVar33) {
          bVar35 = uVar4 <= uVar3;
        }
        if (!bVar35) {
          puVar6[uVar17] = puVar6[uVar26];
          puVar6[uVar26] = uVar20;
          uVar17 = uVar26;
          goto LAB_0026234d;
        }
      }
      bVar35 = uVar25 != 0;
      uVar17 = uVar25 - 1;
      uVar25 = uVar17;
    } while (bVar35);
LAB_002626d8:
    uVar17 = uVar15 - 1;
    if (uVar17 != 0) {
      uVar20 = puVar6[uVar15 - 1];
      puVar6[uVar15 - 1] = *puVar6;
      *puVar6 = uVar20;
      lVar19 = 0;
      while( true ) {
        uVar25 = lVar19 * 2 + 1;
        uVar15 = uVar17;
        if (uVar17 <= uVar25) break;
        pvVar7 = (pmVar31->m_central_dir).m_p;
        pvVar8 = (pmVar31->m_central_dir_offsets).m_p;
        if (lVar19 * 2 + 2U < uVar17) {
          uVar26 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[uVar25] * 4);
          uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[lVar19 * 2 + 2] * 4);
          uVar3 = *(ushort *)((long)pvVar7 + uVar26 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
          uVar10 = uVar4;
          if (uVar3 < uVar4) {
            uVar10 = uVar3;
          }
          bVar18 = 0;
          for (uVar34 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar34 + uVar26 + 0x2e), bVar9 = bVar18,
              pbVar1 < (byte *)((long)pvVar7 + uVar10 + uVar26 + 0x2e); uVar34 = uVar34 + 1) {
            bVar9 = *pbVar1;
            bVar18 = bVar9 + 0x20;
            if (0x19 < (byte)(bVar9 + 0xbf)) {
              bVar18 = bVar9;
            }
            bVar2 = *(byte *)((long)pvVar7 + uVar34 + uVar16 + 0x2e);
            bVar9 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar9 = bVar2;
            }
            if (bVar18 != bVar9) break;
          }
          bVar35 = bVar18 < bVar9;
          if (uVar10 == uVar34) {
            bVar35 = uVar3 < uVar4;
          }
          uVar16 = (ulong)bVar35;
        }
        else {
          uVar16 = 0;
        }
        lVar27 = uVar16 + uVar25;
        uVar25 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar20 * 4);
        uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[lVar27] * 4);
        uVar3 = *(ushort *)((long)pvVar7 + uVar25 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
        uVar10 = uVar4;
        if (uVar3 < uVar4) {
          uVar10 = uVar3;
        }
        bVar18 = 0;
        for (uVar26 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar26 + uVar25 + 0x2e), bVar9 = bVar18,
            pbVar1 < (byte *)((long)pvVar7 + uVar10 + uVar25 + 0x2e); uVar26 = uVar26 + 1) {
          bVar9 = *pbVar1;
          bVar18 = bVar9 + 0x20;
          if (0x19 < (byte)(bVar9 + 0xbf)) {
            bVar18 = bVar9;
          }
          bVar2 = *(byte *)((long)pvVar7 + uVar26 + uVar16 + 0x2e);
          bVar9 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar9 = bVar2;
          }
          if (bVar18 != bVar9) break;
        }
        bVar35 = bVar9 <= bVar18;
        if (uVar10 == uVar26) {
          bVar35 = uVar4 <= uVar3;
        }
        if (bVar35) break;
        puVar6[lVar19] = puVar6[lVar27];
        puVar6[lVar27] = uVar20;
        lVar19 = lVar27;
      }
      goto LAB_002626d8;
    }
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
					const mz_uint8 *pExtra_data;
					void* buf = NULL;

					if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size > n)
					{
						buf = MZ_MALLOC(ext_data_size);
						if(buf==NULL)
							return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

						if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size, buf, ext_data_size) != ext_data_size)
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
						}

						pExtra_data = (mz_uint8*)buf;
					}
					else
					{
						pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
					}

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

						if (extra_size_remaining < (sizeof(mz_uint16) * 2))
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
						}

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

						if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
						}

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);

					MZ_FREE(buf);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}